

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLinOp::AnyAverageDownAndSync
          (MLNodeLinOp *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *sol)

{
  int ratio;
  int ncomp;
  MultiFab *pMVar1;
  FabArray<amrex::FArrayBox> *this_00;
  Periodicity *period;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  MultiFab tmpmf;
  FabFactory<amrex::FArrayBox> local_248;
  MFInfo local_240;
  BoxArray local_218;
  FabArray<amrex::FArrayBox> local_1b0;
  
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  iVar3 = (this->super_MLLinOp).m_num_amr_levels;
  pMVar1 = Any::get<amrex::MultiFab>
                     ((sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                      super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)iVar3 + -1);
  nodalSync(this,iVar3 - 1U,0,pMVar1);
  uVar5 = (ulong)(iVar3 - 1U);
  lVar2 = uVar5 * 8;
  iVar3 = iVar3 + -2;
  while( true ) {
    if ((int)uVar5 < 1) break;
    pMVar1 = Any::get<amrex::MultiFab>
                       ((Any *)((long)&(((sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>
                                         ).
                                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                       super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                       .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                       _M_head_impl + lVar2));
    uVar4 = (int)uVar5 - 1;
    this_00 = &Any::get<amrex::MultiFab>
                         ((sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar4)->
               super_FabArray<amrex::FArrayBox>;
    ratio = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar4];
    amrex::coarsen(&local_218,
                   &(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
    local_240.alloc = true;
    local_240._1_7_ = 0;
    local_240.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_240.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_240.arena = (Arena *)0x0;
    local_240.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    MultiFab::MultiFab((MultiFab *)&local_1b0,&local_218,
                       &(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        distributionMap,ncomp,0,&local_240,&local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_240.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    BoxArray::~BoxArray(&local_218);
    average_down(pMVar1,(MultiFab *)&local_1b0,0,ncomp,ratio);
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy(this_00,&local_1b0,0,0,ncomp,period,COPY);
    nodalSync(this,iVar3,0,(MultiFab *)this_00);
    MultiFab::~MultiFab((MultiFab *)&local_1b0);
    lVar2 = lVar2 + -8;
    iVar3 = iVar3 + -1;
    uVar5 = uVar5 - 1;
  }
  return;
}

Assistant:

void
MLNodeLinOp::AnyAverageDownAndSync (Vector<Any>& sol) const
{
    AMREX_ASSERT(sol[0].is<MultiFab>());

    const int ncomp = getNComp();
    const int finest_amr_lev = NAMRLevels() - 1;

    nodalSync(finest_amr_lev, 0, sol[finest_amr_lev].get<MultiFab>());

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        const auto& fmf = sol[falev  ].get<MultiFab>();
        auto&       cmf = sol[falev-1].get<MultiFab>();

        auto rr = AMRRefRatio(falev-1);
        MultiFab tmpmf(amrex::coarsen(fmf.boxArray(), rr), fmf.DistributionMap(), ncomp, 0);
        amrex::average_down(fmf, tmpmf, 0, ncomp, rr);
        cmf.ParallelCopy(tmpmf, 0, 0, ncomp);
        nodalSync(falev-1, 0, cmf);
    }
}